

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShader_gl_in_ArrayContentsTest::iterate(GeometryShader_gl_in_ArrayContentsTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  void *__s1;
  NotSupportedError *this_01;
  long lVar6;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  bool bVar7;
  uchar reference_data [72];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x191);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  lVar5 = (long)&local_1e8 + 4;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1b8 = 0;
  lVar6 = 0;
  do {
    *(int *)(lVar5 + -8) = (int)lVar6;
    *(undefined8 *)(lVar5 + -4) = 0x100000000;
    *(float *)(lVar5 + -0x14) = (float)(int)lVar6;
    *(undefined8 *)(lVar5 + -0x10) = 0;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x18;
  } while (lVar6 != 3);
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_buffer_object_id);
  bVar7 = true;
  iVar1 = 1;
  while( true ) {
    (**(code **)(lVar4 + 0x1680))((&this->m_program_object_sized_arrays_id)[iVar1 == 1]);
    (**(code **)(lVar4 + 0x30))(4);
    (**(code **)(lVar4 + 0x538))(4,0,3);
    (**(code **)(lVar4 + 0x638))();
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error doing a draw call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1ca);
    __s1 = (void *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,0x48,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not map the buffer object into process space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1d0);
    iVar3 = bcmp(__s1,&local_1f8,0x48);
    if (iVar3 != 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Data extracted from transform feedback is invalid.",0x32);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar7 = false;
    }
    (**(code **)(lVar4 + 0x1670))(0x8c8e);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error unmapping the buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1de);
    if (!bVar7) break;
    iVar1 = iVar1 + -1;
    if (iVar1 != 0) {
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00d0a2c0:
      tcu::TestContext::setTestResult(this_02,testResult,description);
      return STOP;
    }
  }
  this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
  goto LAB_00d0a2c0;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_in_ArrayContentsTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl							= m_context.getRenderContext().getFunctions();
	unsigned char		  reference_data[m_buffer_size] = { 0 };
	bool				  result						= true;

	/* Prepare reference data */
	{
		glw::GLint*   ivec4_data_ptr;
		glw::GLfloat* vec2_data_ptr;

		const unsigned int ivec4_offset_from_vertex = 2 * sizeof(glw::GLfloat);
		const unsigned int vec2_offset_from_vertex  = 0;

		/* Expected data for vertex:
		 * vec2  = {VertexID, 0.0f}
		 * ivec4 = {0,        VertexID, 0, 1}
		 */
		for (unsigned int vertex_id = 0; vertex_id < m_n_vertices_emitted_per_primitive * m_n_emitted_primitives;
			 ++vertex_id)
		{
			const unsigned int vertex_offset = vertex_id * m_n_bytes_emitted_per_vertex;
			const unsigned int ivec4_offset  = vertex_offset + ivec4_offset_from_vertex;
			const unsigned int vec2_offset   = vertex_offset + vec2_offset_from_vertex;

			ivec4_data_ptr = (glw::GLint*)(reference_data + ivec4_offset);
			vec2_data_ptr  = (glw::GLfloat*)(reference_data + vec2_offset);

			ivec4_data_ptr[0] = 0;
			ivec4_data_ptr[1] = vertex_id;
			ivec4_data_ptr[2] = 0;
			ivec4_data_ptr[3] = 1;

			vec2_data_ptr[0] = (float)vertex_id;
			vec2_data_ptr[1] = 0.0f;
		}
	}

	/* Setup transform feedback */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_object_id);

	/* Draw the geometry */
	for (int n_case = 0; n_case < 2 /* unsized/sized array cases */; ++n_case)
	{
		glw::GLuint po_id = (n_case == 0) ? m_program_object_unsized_arrays_id : m_program_object_sized_arrays_id;

		gl.useProgram(po_id);
		gl.beginTransformFeedback(GL_TRIANGLES);
		{
			gl.drawArrays(GL_TRIANGLES, 0 /* first */, 3 /* one triangle */);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error doing a draw call");

		/* Map buffer object storage holding XFB result into process space. */
		glw::GLchar* transform_feedback_data = (glw::GLchar*)gl.mapBufferRange(
			GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, m_buffer_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map the buffer object into process space");

		/* Verify data extracted from transform feedback */
		if (0 != memcmp(transform_feedback_data, reference_data, m_buffer_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Data extracted from transform feedback is invalid."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Unmap the buffer object. */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping the buffer object");

		/* Verify results */
		if (true != result)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}